

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<596u,Fixpp::Type::String>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<596u,Fixpp::Type::String>>> *this,
          FieldRef<Fixpp::TagT<596U,_Fixpp::Type::String>_> *field,ParsingContext *context,
          TagSet<Fixpp::ComponentBlock<Fixpp::TagT<600U,_Fixpp::Type::String>,_Fixpp::TagT<601U,_Fixpp::Type::String>,_Fixpp::TagT<602U,_Fixpp::Type::String>,_Fixpp::TagT<603U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>,_Fixpp::TagT<607U,_Fixpp::Type::Int>,_Fixpp::TagT<608U,_Fixpp::Type::String>,_Fixpp::TagT<609U,_Fixpp::Type::String>,_Fixpp::TagT<764U,_Fixpp::Type::String>,_Fixpp::TagT<610U,_Fixpp::Type::String>,_Fixpp::TagT<611U,_Fixpp::Type::String>,_Fixpp::TagT<248U,_Fixpp::Type::String>,_Fixpp::TagT<249U,_Fixpp::Type::String>,_Fixpp::TagT<250U,_Fixpp::Type::Int>,_Fixpp::TagT<251U,_Fixpp::Type::Int>,_Fixpp::TagT<252U,_Fixpp::Type::Float>,_Fixpp::TagT<253U,_Fixpp::Type::Float>,_Fixpp::TagT<257U,_Fixpp::Type::String>,_Fixpp::TagT<599U,_Fixpp::Type::String>,_Fixpp::TagT<596U,_Fixpp::Type::String>,_Fixpp::TagT<597U,_Fixpp::Type::String>,_Fixpp::TagT<598U,_Fixpp::Type::String>,_Fixpp::TagT<254U,_Fixpp::Type::String>,_Fixpp::TagT<612U,_Fixpp::Type::Float>,_Fixpp::TagT<942U,_Fixpp::Type::String>,_Fixpp::TagT<613U,_Fixpp::Type::Char>,_Fixpp::TagT<614U,_Fixpp::Type::Float>,_Fixpp::TagT<615U,_Fixpp::Type::Float>,_Fixpp::TagT<616U,_Fixpp::Type::String>,_Fixpp::TagT<617U,_Fixpp::Type::String>,_Fixpp::TagT<618U,_Fixpp::Type::Int>,_Fixpp::TagT<619U,_Fixpp::Type::Data>,_Fixpp::TagT<620U,_Fixpp::Type::String>,_Fixpp::TagT<621U,_Fixpp::Type::Int>,_Fixpp::TagT<622U,_Fixpp::Type::Data>,_Fixpp::TagT<623U,_Fixpp::Type::Float>,_Fixpp::TagT<624U,_Fixpp::Type::Char>,_Fixpp::TagT<556U,_Fixpp::Type::String>,_Fixpp::TagT<740U,_Fixpp::Type::String>,_Fixpp::TagT<739U,_Fixpp::Type::String>,_Fixpp::TagT<955U,_Fixpp::Type::String>,_Fixpp::TagT<956U,_Fixpp::Type::String>_>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *this_00;
  long lVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  StreamBuf<char> *pSVar8;
  
  this_00 = context->cursor;
  pSVar8 = this_00->buf;
  lVar1 = *(long *)&pSVar8->field_0x8;
  pcVar2 = *(char **)&pSVar8->field_0x10;
  pcVar5 = pcVar2;
  while( true ) {
    pcVar7 = *(char **)&pSVar8->field_0x18;
    if (pcVar7 == pcVar5) {
      lVar6 = (**(code **)(*(long *)pSVar8 + 0x38))();
      if (lVar6 == 0) {
        ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x254);
        return;
      }
      pSVar8 = this_00->buf;
      pcVar5 = *(char **)&pSVar8->field_0x10;
      pcVar7 = *(char **)&pSVar8->field_0x18;
    }
    if (pcVar5 < pcVar7) {
      cVar4 = *pcVar5;
    }
    else {
      cVar4 = (**(code **)(*(long *)pSVar8 + 0x48))();
    }
    if (cVar4 == '|') break;
    StreamCursor::advance(this_00,1);
    pSVar8 = this_00->buf;
    pcVar5 = *(char **)&pSVar8->field_0x10;
  }
  lVar6 = *(long *)&this_00->buf->field_0x10;
  lVar3 = *(long *)&this_00->buf->field_0x8;
  (field->m_view).first = pcVar2;
  (field->m_view).second = (lVar1 + lVar6) - (long)(pcVar2 + lVar3);
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }